

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  MPP_RET MVar2;
  RK_S32 RVar3;
  pthread_t local_268;
  pthread_t td;
  RK_U8 *buf_ptr;
  size_t sStack_250;
  int buf_fd;
  size_t total_size;
  size_t dst_size;
  size_t src_size;
  MppBuffer buffer;
  IepCtx *ppvStack_228;
  int ch;
  IepTestInfo info;
  IepTestCfg cfg;
  char **argv_local;
  int argc_local;
  
  cfg.colorcvt = (IepCmdParamColorConvert *)argv;
  if (argc < 2) {
    iep_test_help();
    argv_local._4_4_ = 0;
  }
  else {
    memset(&info.ctx,0,0x188);
    memset(&stack0xfffffffffffffdd8,0,0x88);
    cfg.src_w = 0x12;
    cfg.dst_w = 0x12;
    _opterr = 0;
    while (buffer._4_4_ = getopt(argc,(char **)cfg.colorcvt,"f:w:h:c:F:W:H:C:m:x:"),
          buffer._4_4_ != -1) {
      switch(buffer._4_4_) {
      case 0x43:
        cfg.dst_w = str_to_iep_fmt(_optarg);
        break;
      default:
        break;
      case 0x46:
        _mpp_log_l(4,"iep_test","output filename: %s\n",0,_optarg);
        strncpy(cfg.src_url + 0x5c,_optarg,99);
        cfg.fp_src = (FILE *)fopen(cfg.src_url + 0x5c,"w+b");
        break;
      case 0x48:
        cfg.src_fmt = atoi(_optarg);
        break;
      case 0x57:
        cfg.src_h = atoi(_optarg);
        break;
      case 99:
        cfg.src_w = str_to_iep_fmt(_optarg);
        break;
      case 0x66:
        _mpp_log_l(4,"iep_test","input filename: %s\n",0,_optarg);
        strncpy((char *)&cfg.dst_h,_optarg,99);
        cfg._320_8_ = fopen((char *)&cfg.dst_h,"rb");
        break;
      case 0x68:
        info.ctx._4_4_ = atoi(_optarg);
        break;
      case 0x6d:
        iVar1 = strcmp(_optarg,"deinterlace");
        if (iVar1 == 0) {
          cfg.fp_dst._0_4_ = 1;
        }
        else {
          iVar1 = strcmp(_optarg,"yuvenhance");
          if (iVar1 == 0) {
            cfg.fp_dst._0_4_ = 2;
          }
          else {
            iVar1 = strcmp(_optarg,"rgbenhance");
            if (iVar1 == 0) {
              cfg.fp_dst._0_4_ = 3;
            }
            else {
              _mpp_log_l(2,"iep_test","invalid work mode %s\n",0,_optarg);
              cfg.fp_dst._0_4_ = 0;
            }
          }
        }
        break;
      case 0x77:
        info.ctx._0_4_ = atoi(_optarg);
        break;
      case 0x78:
        _mpp_log_l(4,"iep_test","configure filename: %s\n",0,_optarg);
        strncpy(cfg.dst_url + 0x5c,_optarg,99);
        cfg._344_8_ = iniparser_load(cfg.dst_url + 0x5c);
        if ((dictionary *)cfg._344_8_ == (dictionary *)0x0) {
          _mpp_log_l(2,"iep_test","invalid configure file %s\n",0,_optarg);
        }
        else {
          parse_cfg((IepTestCfg *)&info.ctx);
        }
      }
    }
    MVar2 = check_input_cmd((IepTestCfg *)&info.ctx);
    if (MVar2 == MPP_OK) {
      ppvStack_228 = &info.ctx;
      RVar3 = get_image_size((int)info.ctx,info.ctx._4_4_,cfg.src_w);
      info.cfg = (IepTestCfg *)(long)RVar3;
      RVar3 = get_image_size(cfg.src_h,cfg.src_fmt,cfg.dst_w);
      info.src_size = (size_t)RVar3;
      src_size = 0;
      dst_size = (ulong)(info.cfg[10].dst_url + 0x33) & 0xfffffffffffff000;
      total_size = info.src_size + 0xfff & 0xfffffffffffff000;
      sStack_250 = dst_size * 2 + total_size * 2;
      mpp_buffer_get_with_tag(0,&src_size,sStack_250,"iep_test","main");
      if ((src_size == 0) &&
         (_mpp_log_l(2,"iep_test","Assertion %s failed at %s:%d\n",0,"buffer","main",0x212),
         (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      buf_ptr._4_4_ = mpp_buffer_get_fd_with_caller(src_size,"main");
      td = mpp_buffer_get_ptr_with_caller(src_size,"main");
      memset((void *)td,0xff,sStack_250);
      info.dst_size._0_4_ = buf_ptr._4_4_;
      info.dst_size._4_4_ = buf_ptr._4_4_ + (int)dst_size * 0x400;
      info.phy_src0 = buf_ptr._4_4_ + (int)(dst_size << 1) * 0x400;
      info.phy_src1 = buf_ptr._4_4_ + ((int)dst_size * 2 + (int)total_size) * 0x400;
      info.phy_dst0 = (undefined4)td;
      info.phy_dst1 = td._4_4_;
      info.vir_src0 = (RK_U8 *)(td + dst_size);
      info.vir_src1 = (RK_U8 *)(td + dst_size * 2);
      info.vir_dst0 = (RK_U8 *)(td + dst_size * 2 + total_size);
      iep_init(&info.dst.uv_addr);
      pthread_create(&local_268,(pthread_attr_t *)0x0,iep_process_thread,&stack0xfffffffffffffdd8);
      pthread_join(local_268,(void **)0x0);
      if (info.dst._20_8_ != 0) {
        iep_deinit(info.dst._20_8_);
        info.dst.uv_addr = 0;
        info.dst.v_addr = 0;
      }
      if (cfg._320_8_ != 0) {
        fclose((FILE *)cfg._320_8_);
        cfg.cfg_url[0x60] = '\0';
        cfg.cfg_url[0x61] = '\0';
        cfg.cfg_url[0x62] = '\0';
        cfg.cfg_url[99] = '\0';
        cfg._324_4_ = 0;
      }
      if (cfg.fp_src != (FILE *)0x0) {
        fclose((FILE *)cfg.fp_src);
        cfg.fp_src = (FILE *)0x0;
      }
      if (cfg._344_8_ != 0) {
        iniparser_freedict((dictionary *)cfg._344_8_);
        cfg.mode = TEST_CASE_NONE;
        cfg._348_4_ = 0;
        if (cfg.dei_cfg != (IepCmdParamDeiCfg *)0x0) {
          mpp_osal_free("main",cfg.dei_cfg);
        }
        if (cfg.yuv_enh != (IepCmdParamYuvEnhance *)0x0) {
          mpp_osal_free("main",cfg.yuv_enh);
        }
        if (cfg.ini != (dictionary *)0x0) {
          mpp_osal_free("main",cfg.ini);
        }
        if (cfg.rgb_enh != (IepCmdParamRgbEnhance *)0x0) {
          mpp_osal_free("main",cfg.rgb_enh);
        }
      }
      mpp_buffer_put_with_caller(src_size,"main");
      argv_local._4_4_ = 0;
    }
    else {
      _mpp_log_l(2,"iep_test","failed to pass cmd line check\n",0);
      iep_test_help();
      argv_local._4_4_ = -1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    IepTestCfg cfg;
    IepTestInfo info;
    int ch;

    if (argc < 2) {
        iep_test_help();
        return 0;
    }

    memset(&cfg, 0, sizeof(cfg));
    memset(&info, 0, sizeof(info));
    cfg.src_fmt = IEP_FORMAT_YCbCr_420_SP;
    cfg.dst_fmt = IEP_FORMAT_YCbCr_420_SP;

    /// get options
    opterr = 0;
    while ((ch = getopt(argc, argv, "f:w:h:c:F:W:H:C:m:x:")) != -1) {
        switch (ch) {
        case 'w': {
            cfg.src_w = atoi(optarg);
        } break;
        case 'h': {
            cfg.src_h = atoi(optarg);
        } break;
        case 'c': {
            cfg.src_fmt = str_to_iep_fmt(optarg);
        } break;
        case 'W': {
            cfg.dst_w = atoi(optarg);
        } break;
        case 'H': {
            cfg.dst_h = atoi(optarg);
        } break;
        case 'C': {
            cfg.dst_fmt = str_to_iep_fmt(optarg);
        } break;
        case 'f': {
            mpp_log("input filename: %s\n", optarg);
            strncpy(cfg.src_url, optarg, sizeof(cfg.src_url) - 1);
            cfg.fp_src = fopen(cfg.src_url, "rb");
        } break;
        case 'F': {
            mpp_log("output filename: %s\n", optarg);
            strncpy(cfg.dst_url, optarg, sizeof(cfg.dst_url) - 1);
            cfg.fp_dst = fopen(cfg.dst_url, "w+b");
        } break;
        case 'm': {
            if (!strcmp(optarg, "deinterlace")) {
                cfg.mode = TEST_CASE_DEINTERLACE;
            } else if (!strcmp(optarg, "yuvenhance")) {
                cfg.mode = TEST_CASE_YUVENHANCE;
            } else if (!strcmp(optarg, "rgbenhance")) {
                cfg.mode = TEST_CASE_RGBENHANCE;
            } else {
                mpp_err("invalid work mode %s\n", optarg);
                cfg.mode = TEST_CASE_NONE;
            }
        } break;
        case 'x': {
            mpp_log("configure filename: %s\n", optarg);
            strncpy(cfg.cfg_url, optarg, sizeof(cfg.cfg_url) - 1);
            cfg.ini = iniparser_load(cfg.cfg_url);
            if (cfg.ini)
                parse_cfg(&cfg);
            else
                mpp_err("invalid configure file %s\n", optarg);
        } break;
        default: {
        } break;
        }
    }

    if (check_input_cmd(&cfg)) {
        mpp_err("failed to pass cmd line check\n");
        iep_test_help();
        return -1;
    }

    info.cfg = &cfg;
    info.src_size = get_image_size(cfg.src_w, cfg.src_h, cfg.src_fmt);
    info.dst_size = get_image_size(cfg.dst_w, cfg.dst_h, cfg.dst_fmt);

    // allocate 12M in/out memory and initialize memory address
    MppBuffer buffer = NULL;
    size_t src_size = MPP_ALIGN(info.src_size, SZ_4K);
    size_t dst_size = MPP_ALIGN(info.dst_size, SZ_4K);
    // NOTE: deinterlace need 4 fields (2 frames) as input and output 2 frames
    size_t total_size = src_size * 2 + dst_size * 2;

    mpp_buffer_get(NULL, &buffer, total_size);
    mpp_assert(buffer);

    int buf_fd = mpp_buffer_get_fd(buffer);
    RK_U8 *buf_ptr = (RK_U8 *)mpp_buffer_get_ptr(buffer);

    memset(buf_ptr, 0xff, total_size);

    info.phy_src0 = ADD_OFFSET(buf_fd, 0);
    info.phy_src1 = ADD_OFFSET(buf_fd, src_size);
    info.phy_dst0 = ADD_OFFSET(buf_fd, src_size * 2);
    info.phy_dst1 = ADD_OFFSET(buf_fd, src_size * 2 + dst_size);

    info.vir_src0 = buf_ptr;
    info.vir_src1 = buf_ptr + src_size;
    info.vir_dst0 = buf_ptr + src_size * 2;
    info.vir_dst1 = buf_ptr + src_size * 2 + dst_size;

    iep_init(&info.ctx);

    pthread_t td;
    pthread_create(&td, NULL, iep_process_thread, &info);
    pthread_join(td, NULL);

    if (info.ctx) {
        iep_deinit(info.ctx);
        info.ctx = NULL;
    }

    if (cfg.fp_src) {
        fclose(cfg.fp_src);
        cfg.fp_src = NULL;
    }

    if (cfg.fp_dst) {
        fclose(cfg.fp_dst);
        cfg.fp_dst = NULL;
    }

    if (cfg.ini) {
        iniparser_freedict(cfg.ini);
        cfg.ini = NULL;
        if (cfg.yuv_enh)
            mpp_free(cfg.yuv_enh);
        if (cfg.rgb_enh)
            mpp_free(cfg.rgb_enh);
        if (cfg.dei_cfg)
            mpp_free(cfg.dei_cfg);
        if (cfg.colorcvt)
            mpp_free(cfg.colorcvt);
    }

    mpp_buffer_put(buffer);

    return 0;
}